

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

float rr::anon_unknown_19::getFloatingPointMinimumResolvableDifference
                (float maxZValue,ChannelType type)

{
  Float<unsigned_int,_8,_23,_127,_3U> local_20;
  Float<unsigned_int,_8,_23,_127,_3U> local_1c;
  int local_18;
  ChannelType local_14;
  int maxExponent;
  ChannelType type_local;
  float maxZValue_local;
  
  if (type == FLOAT) {
    local_14 = type;
    maxExponent = (int)maxZValue;
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_1c,maxZValue);
    local_18 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_1c);
    local_20 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct(1,local_18 + -0x17,0x800000);
    type_local = (ChannelType)tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&local_20);
  }
  else {
    type_local = SNORM_INT8;
  }
  return (float)type_local;
}

Assistant:

static float getFloatingPointMinimumResolvableDifference (float maxZValue, tcu::TextureFormat::ChannelType type)
{
	if (type == tcu::TextureFormat::FLOAT)
	{
		// 32f
		const int maxExponent = tcu::Float32(maxZValue).exponent();
		return tcu::Float32::construct(+1, maxExponent - 23, 1 << 23).asFloat();
	}

	// unexpected format
	DE_ASSERT(false);
	return 0.0f;
}